

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

Expr __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ReadSymbolicExpr
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *this)

{
  char code;
  TextReader<fmt::Locale> *this_00;
  char *pcVar1;
  int opcode;
  NumericExpr NVar2;
  NumericExpr NVar3;
  bool bVar4;
  
  bVar4 = false;
  do {
    this_00 = this->reader_;
    pcVar1 = (this_00->super_ReaderBase).ptr_;
    (this_00->super_ReaderBase).token_ = pcVar1;
    (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
    code = *pcVar1;
    if (code != 'o') {
      if (code == 'h') {
        TextReader<fmt::Locale>::ReadString(this_00);
        NVar2 = 0;
      }
      else {
        NVar2 = ReadNumericExpr(this,code,false);
      }
LAB_001c9f1e:
      NVar3 = 0;
      if (!bVar4) {
        NVar3 = NVar2;
      }
      return NVar3;
    }
    opcode = ReadOpCode(this);
    if (opcode != 0x41) {
      NVar2 = ReadNumericExpr(this,opcode);
      goto LAB_001c9f1e;
    }
    ReadLogicalExpr(this);
    ReadSymbolicExpr(this);
    bVar4 = true;
  } while( true );
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}